

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::tessellation::anon_unknown_1::UserDefinedIOTest::createInstance
          (UserDefinedIOTest *this,Context *context)

{
  pointer pSVar1;
  TestInstance *pTVar2;
  Context *this_00;
  CaseDefinition *__n;
  long lVar3;
  pointer other;
  SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *__cur;
  undefined1 local_50 [48];
  
  pTVar2 = (TestInstance *)operator_new(0x58);
  CaseDefinition::CaseDefinition((CaseDefinition *)local_50,&this->m_caseDef);
  pTVar2->m_context = context;
  pTVar2->_vptr_TestInstance = (_func_int **)&PTR__UserDefinedIOTestInstance_00bdbc50;
  __n = (CaseDefinition *)local_50;
  CaseDefinition::CaseDefinition((CaseDefinition *)(pTVar2 + 1),__n);
  lVar3 = (long)(this->m_tesInputs).
                super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_tesInputs).
                super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pTVar2[4]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[4].m_context = (Context *)0x0;
  pTVar2[5]._vptr_TestInstance = (_func_int **)0x0;
  this_00 = (Context *)
            std::
            _Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
            ::_M_allocate((_Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                           *)(lVar3 >> 4),(size_t)__n);
  pTVar2[4]._vptr_TestInstance = (_func_int **)this_00;
  pTVar2[4].m_context = this_00;
  pTVar2[5]._vptr_TestInstance = (_func_int **)(lVar3 + (long)this_00);
  pSVar1 = (this->m_tesInputs).
           super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (other = (this->m_tesInputs).
               super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
               ._M_impl.super__Vector_impl_data._M_start; other != pSVar1; other = other + 1) {
    de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
              ((SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *)this_00,other)
    ;
    this_00 = (Context *)&this_00->m_progCollection;
  }
  pTVar2[4].m_context = this_00;
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  return pTVar2;
}

Assistant:

TestInstance* UserDefinedIOTest::createInstance (Context& context) const
{
	return new UserDefinedIOTestInstance(context, m_caseDef, m_tesInputs);
}